

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMLSParserImpl::endElement
          (DOMLSParserImpl *this,XMLElementDecl *elemDecl,uint urlId,bool isRoot,XMLCh *elemPrefix)

{
  ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *this_00;
  DOMNode *pDVar1;
  ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *this_01;
  long *plVar2;
  uint uVar3;
  FilterAction FVar4;
  int iVar5;
  ValueHashTableBucketElem<bool> *pVVar6;
  ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> *pVVar7;
  DOMLSException *this_02;
  undefined4 extraout_var;
  long *plVar8;
  undefined4 extraout_var_00;
  DOMNode *pDVar9;
  FilterAction *pFVar10;
  XMLSize_t hashVal;
  XMLSize_t local_30;
  undefined4 extraout_var_01;
  
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (this_00 = this->fFilterDelayedTextNodes,
     this_00 != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) {
    pDVar1 = (this->super_AbstractDOMParser).fCurrentNode;
    for (pVVar6 = this_00->fBucketList[(ulong)pDVar1 % this_00->fHashModulus];
        pVVar6 != (ValueHashTableBucketElem<bool> *)0x0; pVVar6 = pVVar6->fNext) {
      if ((DOMNode *)pVVar6->fKey == pDVar1) {
        ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeBucketElem(this_00,pDVar1,&local_30);
        applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
        break;
      }
    }
  }
  AbstractDOMParser::endElement(&this->super_AbstractDOMParser,elemDecl,urlId,isRoot,elemPrefix);
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (uVar3 = (*this->fFilter->_vptr_DOMLSParserFilter[4])(), (uVar3 & 1) != 0)) {
    pDVar1 = (this->super_AbstractDOMParser).fCurrentNode;
    this_01 = this->fFilterAction;
    if (this_01 !=
        (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)
        0x0) {
      for (pVVar7 = this_01->fBucketList[(ulong)pDVar1 % this_01->fHashModulus];
          pVVar7 != (ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> *)0x0;
          pVVar7 = pVVar7->fNext) {
        if ((DOMNode *)pVVar7->fKey == pDVar1) {
          pFVar10 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                    ::get(this_01,pDVar1,XMLPlatformUtils::fgMemoryManager);
          FVar4 = *pFVar10;
          ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
          removeBucketElem(this->fFilterAction,pDVar1,&local_30);
          goto LAB_002e52ea;
        }
      }
    }
    FVar4 = (*this->fFilter->_vptr_DOMLSParserFilter[2])(this->fFilter,pDVar1);
LAB_002e52ea:
    if (FVar4 != FILTER_REJECT) {
      if (FVar4 != FILTER_SKIP) {
        if (FVar4 != FILTER_INTERRUPT) {
          return;
        }
        this_02 = (DOMLSException *)__cxa_allocate_exception(0x28);
        DOMLSException::DOMLSException
                  (this_02,0x51,0x22,(this->super_AbstractDOMParser).fMemoryManager);
        __cxa_throw(this_02,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
      }
      iVar5 = (*pDVar1->_vptr_DOMNode[7])(pDVar1);
      plVar2 = (long *)CONCAT44(extraout_var,iVar5);
      while (plVar2 != (long *)0x0) {
        plVar8 = (long *)(**(code **)(*plVar2 + 0x50))(plVar2);
        pDVar9 = (this->super_AbstractDOMParser).fCurrentParent;
        (*pDVar9->_vptr_DOMNode[0x11])(pDVar9,plVar2);
        plVar2 = plVar8;
      }
    }
    iVar5 = (*pDVar1->_vptr_DOMNode[9])(pDVar1);
    if (CONCAT44(extraout_var_00,iVar5) == 0) {
      pDVar9 = (this->super_AbstractDOMParser).fCurrentParent;
    }
    else {
      iVar5 = (*pDVar1->_vptr_DOMNode[9])(pDVar1);
      pDVar9 = (DOMNode *)CONCAT44(extraout_var_01,iVar5);
    }
    (this->super_AbstractDOMParser).fCurrentNode = pDVar9;
    pDVar9 = (this->super_AbstractDOMParser).fCurrentParent;
    (*pDVar9->_vptr_DOMNode[0x10])(pDVar9,pDVar1);
    (*pDVar1->_vptr_DOMNode[0x27])(pDVar1);
  }
  return;
}

Assistant:

void DOMLSParserImpl::endElement(const XMLElementDecl& elemDecl
                               , const unsigned int    urlId
                               , const bool            isRoot
                               , const XMLCh* const    elemPrefix)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    AbstractDOMParser::endElement(elemDecl, urlId, isRoot, elemPrefix);
    if(fFilter)
    {
        DOMNodeFilter::ShowType whatToShow=fFilter->getWhatToShow();
        if(whatToShow & DOMNodeFilter::SHOW_ELEMENT)
        {
            DOMNode* thisNode = fCurrentNode;
            DOMLSParserFilter::FilterAction action;
            if(fFilterAction && fFilterAction->containsKey(thisNode))
            {
                action = fFilterAction->get(thisNode);
                fFilterAction->removeKey(thisNode);
            }
            else
                action = fFilter->acceptNode(thisNode);
            switch(action)
            {
            case DOMLSParserFilter::FILTER_ACCEPT:      break;
            case DOMLSParserFilter::FILTER_REJECT:      fCurrentNode = (thisNode->getPreviousSibling()?thisNode->getPreviousSibling():fCurrentParent);
                                                        fCurrentParent->removeChild(thisNode);
                                                        thisNode->release();
                                                        break;
            case DOMLSParserFilter::FILTER_SKIP:        {
                                                            DOMNode* child=thisNode->getFirstChild();
                                                            while(child)
                                                            {
                                                                DOMNode* next=child->getNextSibling();
                                                                fCurrentParent->appendChild(child);
                                                                child=next;
                                                            }
                                                            fCurrentNode = (thisNode->getPreviousSibling()?thisNode->getPreviousSibling():fCurrentParent);
                                                            fCurrentParent->removeChild(thisNode);
                                                            thisNode->release();
                                                        }
                                                        break;
            case DOMLSParserFilter::FILTER_INTERRUPT:   throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingAborted, fMemoryManager);
            }
        }
    }
}